

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::MessageFieldGenerator
          (MessageFieldGenerator *this,FieldDescriptor *descriptor,int fieldOrdinal,Options *options
          )

{
  mapped_type *pmVar1;
  allocator local_101;
  key_type local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator local_99;
  key_type local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Options *local_28;
  Options *options_local;
  FieldDescriptor *pFStack_18;
  int fieldOrdinal_local;
  FieldDescriptor *descriptor_local;
  MessageFieldGenerator *this_local;
  
  local_28 = options;
  options_local._4_4_ = fieldOrdinal;
  pFStack_18 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,fieldOrdinal,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__MessageFieldGenerator_006f3af0;
  FieldGeneratorBase::name_abi_cxx11_(&local_68,&this->super_FieldGeneratorBase);
  std::operator+(&local_48,&local_68,"_ != null");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"has_property_check",&local_99);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_98);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  FieldGeneratorBase::name_abi_cxx11_(&local_e0,&this->super_FieldGeneratorBase);
  std::operator+(&local_c0,&local_e0,"_ == null");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"has_not_property_check",&local_101);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_100);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

MessageFieldGenerator::MessageFieldGenerator(const FieldDescriptor* descriptor,
                                             int fieldOrdinal,
                                             const Options *options)
    : FieldGeneratorBase(descriptor, fieldOrdinal, options) {
  variables_["has_property_check"] = name() + "_ != null";
  variables_["has_not_property_check"] = name() + "_ == null";
}